

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

CppTypeName * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::typeName
          (CppTypeName *__return_storage_ptr__,CapnpcCppMain *this,Type type,
          Maybe<capnp::InterfaceSchema::Method> *method)

{
  bool bVar1;
  Reader brand;
  undefined1 auVar2 [40];
  NullableValue<capnp::InterfaceSchema::Method> *pNVar3;
  undefined4 index;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Which WVar7;
  anon_union_2_2_d12d5221_for_Type_3 aVar8;
  Schema SVar9;
  uint *puVar10;
  CppTypeName *pCVar11;
  undefined8 uVar12;
  char *pcVar13;
  CppTypeName *result_1;
  char *this_00;
  CppTypeName *ptrCopy;
  InterfaceSchema IVar14;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  Type type_00;
  Reader RVar15;
  StringPtr innerName;
  Array<capnp::(anonymous_namespace)::CppTypeName> result;
  ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> params;
  Fault f;
  Type local_198;
  Maybe<capnp::InterfaceSchema::Method> local_188;
  undefined1 local_138 [48];
  Reader local_108;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  Schema local_a0;
  Maybe<capnp::InterfaceSchema::Method> local_98;
  PointerReader local_50;
  
  local_198.field_4 = type.field_4;
  uVar12 = type._0_8_;
  local_198.listDepth = type.listDepth;
  WVar7 = LIST;
  if (local_198.listDepth == '\0') {
    WVar7 = type.baseType;
  }
  puVar10 = &switchD_00165782::switchdataD_002290a8;
  local_198._0_8_ = uVar12;
  switch(WVar7) {
  case VOID:
    this_00 = " ::capnp::Void";
    goto LAB_00165c1d;
  case BOOL:
    this_00 = "bool";
    pcVar13 = (char *)0x5;
    break;
  case INT8:
    this_00 = " ::int8_t";
    pcVar13 = (char *)0xa;
    break;
  case INT16:
    this_00 = " ::int16_t";
    goto LAB_00165c2e;
  case INT32:
    this_00 = " ::int32_t";
    goto LAB_00165c2e;
  case INT64:
    this_00 = " ::int64_t";
    goto LAB_00165c2e;
  case UINT8:
    this_00 = " ::uint8_t";
LAB_00165c2e:
    pcVar13 = (char *)0xb;
    break;
  case UINT16:
    this_00 = " ::uint16_t";
    goto LAB_00165d23;
  case UINT32:
    this_00 = " ::uint32_t";
    goto LAB_00165d23;
  case UINT64:
    this_00 = " ::uint64_t";
LAB_00165d23:
    pcVar13 = (char *)0xc;
    break;
  case FLOAT32:
    this_00 = "float";
    pcVar13 = (char *)0x6;
    break;
  case FLOAT64:
    this_00 = "double";
    pcVar13 = (char *)0x7;
    break;
  case TEXT:
    this_00 = " ::capnp::Text";
    goto LAB_00165c1d;
  case DATA:
    this_00 = " ::capnp::Data";
LAB_00165c1d:
    pcVar13 = (char *)0xf;
    break;
  case LIST:
    name.content.size_ = (size_t)&switchD_00165782::switchdataD_002290a8;
    name.content.ptr = (char *)0x6;
    CppTypeName::makeNamespace(__return_storage_ptr__,(CppTypeName *)0x2295dd,name);
    local_138._0_8_ =
         kj::_::HeapArrayDisposer::allocateImpl
                   (0x40,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_138._16_8_ = local_138._0_8_ + 0x80;
    local_138._24_8_ = &kj::_::HeapArrayDisposer::instance;
    local_138._8_8_ = local_138._0_8_;
    type_00 = (Type)Type::asList(&local_198);
    local_98.ptr.isSet = (method->ptr).isSet;
    if (local_98.ptr.isSet == true) {
      local_98.ptr.field_1.value.parent.super_Schema.raw =
           (InterfaceSchema)(method->ptr).field_1.value.parent.super_Schema.raw;
      local_98.ptr.field_1._8_8_ = *(undefined8 *)((long)&(method->ptr).field_1 + 8);
      local_98.ptr.field_1.value.proto._reader.segment =
           (method->ptr).field_1.value.proto._reader.segment;
      local_98.ptr.field_1.value.proto._reader.capTable =
           (method->ptr).field_1.value.proto._reader.capTable;
      local_98.ptr.field_1.value.proto._reader.data = (method->ptr).field_1.value.proto._reader.data
      ;
      local_98.ptr.field_1.value.proto._reader.pointers =
           (method->ptr).field_1.value.proto._reader.pointers;
      pNVar3 = &method->ptr;
      local_98.ptr.field_1._48_4_ = *(StructDataBitCount *)((long)&pNVar3->field_1 + 0x30);
      local_98.ptr.field_1._52_2_ = *(StructPointerCount *)((long)&pNVar3->field_1 + 0x34);
      local_98.ptr.field_1._54_2_ = *(undefined2 *)((long)&pNVar3->field_1 + 0x36);
      local_98.ptr.field_1._56_8_ =
           *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
    }
    typeName((CppTypeName *)&local_188,this,type_00,&local_98);
    uVar12 = local_138._8_8_;
    ((StringTree *)local_138._8_8_)->size_ = local_188.ptr._0_8_;
    (((StringTree *)local_138._8_8_)->text).content.ptr =
         (char *)local_188.ptr.field_1.value.parent.super_Schema.raw;
    (((StringTree *)local_138._8_8_)->text).content.size_ = local_188.ptr.field_1._8_8_;
    (((StringTree *)local_138._8_8_)->text).content.disposer =
         (ArrayDisposer *)local_188.ptr.field_1.value.proto._reader.segment;
    (((StringTree *)local_138._8_8_)->branches).ptr =
         (Branch *)local_188.ptr.field_1.value.proto._reader.capTable;
    (((StringTree *)local_138._8_8_)->branches).size_ =
         (size_t)local_188.ptr.field_1.value.proto._reader.data;
    (((StringTree *)local_138._8_8_)->branches).disposer =
         (ArrayDisposer *)local_188.ptr.field_1.value.proto._reader.pointers;
    *(StructDataBitCount *)(local_138._8_8_ + 0x38) =
         local_188.ptr.field_1.value.proto._reader.dataSize;
    local_138._8_8_ = local_138._8_8_ + 0x40;
    local_188.ptr.field_1.value.proto._reader.data = (void *)0x0;
    local_188.ptr.field_1.value.proto._reader.capTable = (CapTableReader *)0x0;
    local_188.ptr.field_1._8_8_ = (ArrayDisposer *)0x0;
    local_188.ptr.field_1.value.parent.super_Schema.raw = (InterfaceSchema)(Schema)0x0;
    WVar7 = LIST;
    if (((undefined1  [16])type_00 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
      WVar7 = type_00.baseType;
    }
    if (ANY_POINTER < WVar7) {
      kj::_::unreachable();
    }
    name_00.content.size_ = (size_t)&DAT_00229438;
    name_00.content.ptr = *(char **)(&DAT_00229438 + (ulong)WVar7 * 8);
    CppTypeName::makePrimitive
              ((CppTypeName *)&local_188,
               (CppTypeName *)(&DAT_002293e8 + *(int *)(&DAT_002293e8 + (ulong)WVar7 * 4)),name_00);
    uVar6 = local_138._24_8_;
    uVar4 = local_138._0_8_;
    (((CppTypeName *)(uVar12 + 0x40))->name).size_ = local_188.ptr._0_8_;
    (((CppTypeName *)(uVar12 + 0x40))->name).text.content.ptr =
         (char *)local_188.ptr.field_1.value.parent.super_Schema.raw;
    (((CppTypeName *)(uVar12 + 0x40))->name).text.content.size_ = local_188.ptr.field_1._8_8_;
    (((CppTypeName *)(uVar12 + 0x40))->name).text.content.disposer =
         (ArrayDisposer *)local_188.ptr.field_1.value.proto._reader.segment;
    (((CppTypeName *)(uVar12 + 0x40))->name).branches.ptr =
         (Branch *)local_188.ptr.field_1.value.proto._reader.capTable;
    (((CppTypeName *)(uVar12 + 0x40))->name).branches.size_ =
         (size_t)local_188.ptr.field_1.value.proto._reader.data;
    (((CppTypeName *)(uVar12 + 0x40))->name).branches.disposer =
         (ArrayDisposer *)local_188.ptr.field_1.value.proto._reader.pointers;
    pCVar11 = (CppTypeName *)(uVar12 + 0x40);
    pCVar11->isArgDependent = (bool)local_188.ptr.field_1.value.proto._reader.dataSize._0_1_;
    pCVar11->needsTypename = (bool)local_188.ptr.field_1.value.proto._reader.dataSize._1_1_;
    pCVar11->hasInterfaces_ = (bool)local_188.ptr.field_1.value.proto._reader.dataSize._2_1_;
    pCVar11->hasDisambiguatedTemplate_ =
         (bool)local_188.ptr.field_1.value.proto._reader.dataSize._3_1_;
    local_188.ptr.field_1.value.proto._reader.data = (void *)0x0;
    local_188.ptr.field_1.value.proto._reader.capTable = (CapTableReader *)0x0;
    IVar14.super_Schema.raw = (Schema)(uVar12 + (0x80 - local_138._0_8_) >> 6);
    local_188.ptr._0_8_ = local_138._0_8_;
    local_188.ptr.field_1._8_8_ = local_138._24_8_;
    local_138._0_8_ = (SegmentReader *)0x0;
    local_138._8_8_ = (CapTableReader *)0x0;
    local_138._16_8_ = (byte *)0x0;
    innerName.content.size_ = 5;
    innerName.content.ptr = "List";
    local_188.ptr.field_1.value.parent.super_Schema.raw = (InterfaceSchema)IVar14.super_Schema.raw;
    CppTypeName::addMemberTemplate
              (__return_storage_ptr__,innerName,
               (Array<capnp::(anonymous_namespace)::CppTypeName> *)&local_188);
    if ((CppTypeName *)uVar4 != (CppTypeName *)0x0) {
      local_188.ptr._0_8_ = (CppTypeName *)0x0;
      local_188.ptr.field_1.value.parent.super_Schema.raw = (InterfaceSchema)(Schema)0x0;
      (**(_func_int **)*(WirePointer *)uVar6)
                (uVar6,uVar4,0x40,IVar14.super_Schema.raw,IVar14.super_Schema.raw,
                 kj::ArrayDisposer::Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::
                 destruct);
    }
    uVar5 = local_138._16_8_;
    uVar4 = local_138._8_8_;
    uVar12 = local_138._0_8_;
    if ((SegmentReader *)local_138._0_8_ == (SegmentReader *)0x0) {
      return __return_storage_ptr__;
    }
    local_138._0_8_ = (SegmentReader *)0x0;
    local_138._8_8_ = (CapTableReader *)0x0;
    local_138._16_8_ = (byte *)0x0;
    (**(_func_int **)*(WirePointer *)uVar6)
              (uVar6,uVar12,0x40,(long)(uVar4 - uVar12) >> 6,(long)(uVar5 - uVar12) >> 6,
               kj::ArrayDisposer::Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::
               destruct);
    return __return_storage_ptr__;
  case ENUM:
    SVar9.raw = (RawBrandedSchema *)Type::asEnum(&local_198);
    goto LAB_00165b3a;
  case STRUCT:
    SVar9.raw = (RawBrandedSchema *)Type::asStruct(&local_198);
LAB_00165b3a:
    bVar1 = (method->ptr).isSet;
    if (bVar1 == true) {
      local_188.ptr.field_1.value.parent.super_Schema.raw =
           (InterfaceSchema)(method->ptr).field_1.value.parent.super_Schema.raw;
      local_188.ptr.field_1._8_8_ = *(size_t *)((long)&(method->ptr).field_1 + 8);
      local_188.ptr.field_1.value.proto._reader.segment =
           (method->ptr).field_1.value.proto._reader.segment;
      local_188.ptr.field_1.value.proto._reader.capTable =
           (method->ptr).field_1.value.proto._reader.capTable;
      local_188.ptr.field_1.value.proto._reader.data =
           (method->ptr).field_1.value.proto._reader.data;
      local_188.ptr.field_1.value.proto._reader.pointers =
           (method->ptr).field_1.value.proto._reader.pointers;
      local_188.ptr.field_1._48_8_ =
           *(undefined8 *)&(method->ptr).field_1.value.proto._reader.dataSize;
      local_188.ptr.field_1._56_8_ =
           *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
    }
    local_188.ptr.isSet = bVar1;
    cppFullName(__return_storage_ptr__,this,SVar9,SVar9,&local_188);
    return __return_storage_ptr__;
  case INTERFACE:
    SVar9.raw = (RawBrandedSchema *)Type::asInterface(&local_198);
    bVar1 = (method->ptr).isSet;
    if (bVar1 == true) {
      local_188.ptr.field_1.value.parent.super_Schema.raw =
           (InterfaceSchema)(method->ptr).field_1.value.parent.super_Schema.raw;
      local_188.ptr.field_1._8_8_ = *(size_t *)((long)&(method->ptr).field_1 + 8);
      local_188.ptr.field_1.value.proto._reader.segment =
           (method->ptr).field_1.value.proto._reader.segment;
      local_188.ptr.field_1.value.proto._reader.capTable =
           (method->ptr).field_1.value.proto._reader.capTable;
      local_188.ptr.field_1.value.proto._reader.data =
           (method->ptr).field_1.value.proto._reader.data;
      local_188.ptr.field_1.value.proto._reader.pointers =
           (method->ptr).field_1.value.proto._reader.pointers;
      local_188.ptr.field_1._48_8_ =
           *(undefined8 *)&(method->ptr).field_1.value.proto._reader.dataSize;
      local_188.ptr.field_1._56_8_ =
           *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
    }
    local_188.ptr.isSet = bVar1;
    cppFullName(__return_storage_ptr__,this,SVar9,SVar9,&local_188);
    __return_storage_ptr__->hasInterfaces_ = true;
    return __return_storage_ptr__;
  case ANY_POINTER:
    Type::getBrandParameter((Maybe<capnp::Type::BrandParameter> *)&local_188,&local_198);
    if (local_188.ptr.isSet == true) {
      index = local_188.ptr.field_1._8_4_;
      local_b8 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      uStack_b0 = 0x7fffffff;
      auVar2 = ZEXT1640(ZEXT816(0));
      brand._reader._40_8_ = 0x7fffffff;
      brand._reader.segment = (SegmentReader *)auVar2._0_8_;
      brand._reader.capTable = (CapTableReader *)auVar2._8_8_;
      brand._reader.data = (void *)auVar2._16_8_;
      brand._reader.pointers = (WirePointer *)auVar2._24_8_;
      brand._reader.dataSize = auVar2._32_4_;
      brand._reader.pointerCount = auVar2._36_2_;
      brand._reader._38_2_ = auVar2._38_2_;
      local_a0 = SchemaLoader::get(&this->schemaLoader,
                                   (uint64_t)local_188.ptr.field_1.value.parent.super_Schema.raw,
                                   brand,(Schema)0x2872a0);
      Schema::getProto(&local_108,&local_a0);
      if (local_108._reader.pointerCount < 6) {
        local_108._reader.capTable = (CapTableReader *)0x0;
        local_188.ptr.field_1._8_8_ = (WirePointer *)0x0;
        local_108._reader.segment = (SegmentReader *)0x0;
        local_108._reader.nestingLimit = 0x7fffffff;
      }
      else {
        local_188.ptr.field_1._8_8_ = local_108._reader.pointers + 5;
      }
      local_188.ptr.field_1._16_4_ = local_108._reader.nestingLimit;
      local_188.ptr._0_8_ = local_108._reader.segment;
      local_188.ptr.field_1.value.parent.super_Schema.raw =
           (InterfaceSchema)local_108._reader.capTable;
      _::PointerReader::getList
                ((ListReader *)local_138,(PointerReader *)&local_188,INLINE_COMPOSITE,(word *)0x0);
      _::ListReader::getStructElement((StructReader *)&local_188,(ListReader *)local_138,index);
      local_50.pointer = (WirePointer *)(SegmentReader *)0x0;
      pCVar11 = (CppTypeName *)0x0;
      local_50.capTable = (CapTableReader *)(RawBrandedSchema *)0x0;
      local_50.nestingLimit = 0x7fffffff;
      if (local_188.ptr.field_1._28_2_ != 0) {
        local_50.pointer = (WirePointer *)local_188.ptr.field_1.value.proto._reader.segment;
        pCVar11 = (CppTypeName *)local_188.ptr._0_8_;
        local_50.capTable = (CapTableReader *)local_188.ptr.field_1.value.parent.super_Schema.raw;
        local_50.nestingLimit = local_188.ptr.field_1._32_4_;
      }
      local_50.segment = (SegmentReader *)pCVar11;
      RVar15 = _::PointerReader::getBlob<capnp::Text>(&local_50,(void *)0x0,0);
      name_03.content.ptr = RVar15.super_StringPtr.content.size_;
      name_03.content.size_ = (size_t)pCVar11;
      CppTypeName::makeTemplateParam
                (__return_storage_ptr__,RVar15.super_StringPtr.content.ptr,name_03);
      return __return_storage_ptr__;
    }
    Type::getImplicitParameter((Type *)&local_188);
    if (local_188.ptr.isSet == true) {
      if ((method->ptr).isSet == true) {
        local_138._0_8_ = (method->ptr).field_1.value.proto._reader.segment;
        local_138._8_8_ = (method->ptr).field_1.value.proto._reader.capTable;
        local_138._16_8_ = (method->ptr).field_1.value.proto._reader.data;
        local_138._24_8_ = (method->ptr).field_1.value.proto._reader.pointers;
        pNVar3 = &method->ptr;
        local_138._32_4_ = *(StructDataBitCount *)((long)&pNVar3->field_1 + 0x30);
        local_138._36_2_ = *(StructPointerCount *)((long)&pNVar3->field_1 + 0x34);
        local_138[0x26] = *(undefined1 *)((long)&pNVar3->field_1 + 0x36);
        local_138[0x27] = *(undefined1 *)((long)&pNVar3->field_1 + 0x37);
        local_138._40_4_ = *(int *)((long)&(method->ptr).field_1 + 0x38);
        local_138._44_4_ = *(undefined4 *)((long)&(method->ptr).field_1 + 0x3c);
        capnp::schema::Method::Reader::getImplicitParameters
                  ((Reader *)&local_188,(Reader *)local_138);
        if ((uint)local_188.ptr._4_4_ < (uint)local_188.ptr.field_1._16_4_) {
          _::ListReader::getStructElement
                    ((StructReader *)local_138,(ListReader *)&local_188,local_188.ptr._4_4_);
          RVar15 = capnp::schema::Node::Parameter::Reader::getName((Reader *)local_138);
          name_02.content.ptr = RVar15.super_StringPtr.content.size_;
          name_02.content.size_ = (size_t)puVar10;
          CppTypeName::makeTemplateParam
                    (__return_storage_ptr__,RVar15.super_StringPtr.content.ptr,name_02);
          return __return_storage_ptr__;
        }
        local_108._reader.segment = (SegmentReader *)0x0;
        local_138._0_8_ = (SegmentReader *)0x0;
        local_138._8_8_ = (CapTableReader *)0x0;
        kj::_::Debug::Fault::init
                  ((Fault *)&local_108,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)&local_108);
      }
switchD_00165ead_caseD_0:
      this_00 = " ::capnp::AnyPointer";
LAB_00165ed5:
      pcVar13 = (char *)0x15;
    }
    else {
      aVar8.paramIndex = 0;
      if (local_198.field_4.schema == (RawBrandedSchema *)0x0) {
        aVar8.paramIndex = local_198.field_3.paramIndex;
      }
      if (local_198.isImplicitParam != false) {
        aVar8.paramIndex = 0;
      }
      puVar10 = &switchD_00165ead::switchdataD_002290f4;
      switch(aVar8.paramIndex) {
      case 0:
        goto switchD_00165ead_caseD_0;
      case 1:
        this_00 = " ::capnp::AnyStruct";
        pcVar13 = (char *)0x14;
        break;
      case 2:
        this_00 = " ::capnp::AnyList";
        pcVar13 = (char *)0x12;
        break;
      case 3:
        this->hasInterfaces = true;
        this_00 = " ::capnp::Capability";
        goto LAB_00165ed5;
      default:
        goto switchD_00165782_default;
      }
    }
    break;
  default:
switchD_00165782_default:
    kj::_::unreachable();
  }
  name_01.content.size_ = (size_t)puVar10;
  name_01.content.ptr = pcVar13;
  CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)this_00,name_01);
  return __return_storage_ptr__;
}

Assistant:

CppTypeName typeName(Type type, kj::Maybe<InterfaceSchema::Method> method) {
    switch (type.which()) {
      case schema::Type::VOID: return CppTypeName::makePrimitive(" ::capnp::Void");

      case schema::Type::BOOL: return CppTypeName::makePrimitive("bool");
      case schema::Type::INT8: return CppTypeName::makePrimitive(" ::int8_t");
      case schema::Type::INT16: return CppTypeName::makePrimitive(" ::int16_t");
      case schema::Type::INT32: return CppTypeName::makePrimitive(" ::int32_t");
      case schema::Type::INT64: return CppTypeName::makePrimitive(" ::int64_t");
      case schema::Type::UINT8: return CppTypeName::makePrimitive(" ::uint8_t");
      case schema::Type::UINT16: return CppTypeName::makePrimitive(" ::uint16_t");
      case schema::Type::UINT32: return CppTypeName::makePrimitive(" ::uint32_t");
      case schema::Type::UINT64: return CppTypeName::makePrimitive(" ::uint64_t");
      case schema::Type::FLOAT32: return CppTypeName::makePrimitive("float");
      case schema::Type::FLOAT64: return CppTypeName::makePrimitive("double");

      case schema::Type::TEXT: return CppTypeName::makePrimitive(" ::capnp::Text");
      case schema::Type::DATA: return CppTypeName::makePrimitive(" ::capnp::Data");

      case schema::Type::ENUM:
        return cppFullName(type.asEnum(), method);
      case schema::Type::STRUCT:
        return cppFullName(type.asStruct(), method);
      case schema::Type::INTERFACE: {
        auto result = cppFullName(type.asInterface(), method);
        result.setHasInterfaces();
        return result;
      }

      case schema::Type::LIST: {
        CppTypeName result = CppTypeName::makeNamespace("capnp");
        auto params = kj::heapArrayBuilder<CppTypeName>(2);
        auto list = type.asList();
        params.add(typeName(list.getElementType(), method));
        params.add(whichKind(list.whichElementType()));
        result.addMemberTemplate("List", params.finish());
        return result;
      }

      case schema::Type::ANY_POINTER:
        KJ_IF_MAYBE(param, type.getBrandParameter()) {
          return CppTypeName::makeTemplateParam(schemaLoader.get(param->scopeId).getProto()
              .getParameters()[param->index].getName());
        } else KJ_IF_MAYBE(param, type.getImplicitParameter()) {
          KJ_IF_MAYBE(m, method) {
            auto params = m->getProto().getImplicitParameters();
            KJ_REQUIRE(param->index < params.size());
            return CppTypeName::makeTemplateParam(params[param->index].getName());
          } else {
            return CppTypeName::makePrimitive(" ::capnp::AnyPointer");
          }
        } else {
          switch (type.whichAnyPointerKind()) {
            case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
              return CppTypeName::makePrimitive(" ::capnp::AnyPointer");
            case schema::Type::AnyPointer::Unconstrained::STRUCT:
              return CppTypeName::makePrimitive(" ::capnp::AnyStruct");
            case schema::Type::AnyPointer::Unconstrained::LIST:
              return CppTypeName::makePrimitive(" ::capnp::AnyList");
            case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
              hasInterfaces = true;  // Probably need to #include <capnp/capability.h>.
              return CppTypeName::makePrimitive(" ::capnp::Capability");
          }